

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_materials_array
rf_load_materials_from_mtl(char *filename,rf_allocator allocator,rf_io_callbacks io)

{
  rf_materials_array rVar1;
  long lVar2;
  long *in_FS_OFFSET;
  undefined1 local_f4 [132];
  long local_70;
  rf_int i;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  tinyobj_material_t *local_40;
  tinyobj_material_t *mats;
  size_t size;
  char *filename_local;
  rf_allocator allocator_local;
  rf_materials_array result;
  
  allocator_local.user_data = allocator.allocator_proc;
  filename_local = (char *)allocator.user_data;
  if (filename == (char *)0x0) {
    allocator_local.allocator_proc = (rf_allocator_proc *)0x0;
    result.size = 0;
  }
  else {
    size = (size_t)filename;
    memset(&allocator_local.allocator_proc,0,0x10);
    lVar2 = *in_FS_OFFSET;
    *(char **)(lVar2 + -0x440) = filename_local;
    *(void **)(lVar2 + -0x438) = allocator_local.user_data;
    lVar2 = *in_FS_OFFSET;
    *(void **)(lVar2 + -0x430) = io.user_data;
    *(_func_rf_int_void_ptr_char_ptr **)(lVar2 + -0x428) = io.file_size_proc;
    *(_func__Bool_void_ptr_char_ptr_void_ptr_rf_int **)(lVar2 + -0x420) = io.read_file_proc;
    mats = (tinyobj_material_t *)0x0;
    local_40 = (tinyobj_material_t *)0x0;
    tinyobj_parse_mtl_file(&local_40,(size_t *)&mats,(char *)size,rf_tinyobj_file_reader_callback);
    tinyobj_materials_free(local_40,(size_t)allocator_local.allocator_proc);
    allocator_local.allocator_proc = (rf_allocator_proc *)mats;
    lVar2 = *in_FS_OFFSET;
    memset(&local_58,0,0x18);
    *(undefined8 *)(lVar2 + -0x430) = local_58;
    *(undefined8 *)(lVar2 + -0x428) = local_50;
    *(undefined8 *)(lVar2 + -0x420) = local_48;
    lVar2 = *in_FS_OFFSET;
    i = 0;
    local_60 = 0;
    *(undefined8 *)(lVar2 + -0x440) = 0;
    *(undefined8 *)(lVar2 + -0x438) = 0;
    for (local_70 = 0; local_70 < (long)allocator_local.allocator_proc; local_70 = local_70 + 1) {
      lVar2 = local_70 * 0x98;
      rf_get_default_shader();
      memcpy((void *)(result.size + lVar2),local_f4,0x84);
    }
  }
  rVar1.materials = (rf_material *)result.size;
  rVar1.size = (rf_int)allocator_local.allocator_proc;
  return rVar1;
}

Assistant:

RF_API rf_materials_array rf_load_materials_from_mtl(const char* filename, rf_allocator allocator, rf_io_callbacks io)
{
    if (!filename) return (rf_materials_array) {0};

    rf_materials_array result = {0};

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(allocator);
    RF_SET_TINYOBJ_IO_CALLBACKS(io);
    {
        size_t size = 0;
        tinyobj_material_t* mats = 0;
        if (tinyobj_parse_mtl_file(&mats, (size_t*) &size, filename, rf_tinyobj_file_reader_callback) != TINYOBJ_SUCCESS)
        {
            // Log Error
        }
        tinyobj_materials_free(mats, result.size);

        result.size = size;
    }
    RF_SET_TINYOBJ_IO_CALLBACKS(RF_NULL_IO);
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    // Set materials shader to default (DIFFUSE, SPECULAR, NORMAL)
    for (rf_int i = 0; i < result.size; i++)
    {
        result.materials[i].shader = rf_get_default_shader();
    }

    return result;
}